

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

uchar * glfwGetJoystickHats(int jid,int *count)

{
  int iVar1;
  
  *count = 0;
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((uint)jid < 0x10) {
    if ((_glfw.joysticks[(uint)jid].present != 0) &&
       (iVar1 = _glfwPlatformPollJoystick(_glfw.joysticks + (uint)jid,2), iVar1 != 0)) {
      *count = _glfw.joysticks[(uint)jid].hatCount;
      return _glfw.joysticks[(uint)jid].hats;
    }
  }
  else {
    _glfwInputError(0x10003,"Invalid joystick ID %i");
  }
  return (uchar *)0x0;
}

Assistant:

char* glfwGetJoystickHats(int jid, int* count)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    js = _glfw.joysticks + jid;
    if (!js->present)
        return NULL;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_BUTTONS))
        return NULL;

    *count = js->hatCount;
    return js->hats;
}